

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_expr(easm_expr *expr)

{
  int local_14;
  int i;
  easm_expr *expr_local;
  
  if (expr != (easm_expr *)0x0) {
    for (local_14 = 0; local_14 < expr->swizzlesnum; local_14 = local_14 + 1) {
      free(expr->swizzles[local_14].str);
    }
    free(expr->swizzles);
    easm_del_expr(expr->e1);
    easm_del_expr(expr->e2);
    free((expr->astr).str);
    free(expr->str);
    easm_del_sinsn(expr->sinsn);
    easm_del_mods(expr->mods);
    free(expr);
  }
  return;
}

Assistant:

void easm_del_expr(struct easm_expr *expr) {
	if (!expr) return;
	int i;
	for (i = 0; i < expr->swizzlesnum; i++)
		free(expr->swizzles[i].str);
	free(expr->swizzles);
	easm_del_expr(expr->e1);
	easm_del_expr(expr->e2);
	free(expr->astr.str);
	free(expr->str);
	easm_del_sinsn(expr->sinsn);
	easm_del_mods(expr->mods);
	free(expr);
}